

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmbtoken.cc
# Opt level: O1

int pmbtoken_exp2_read(TRUST_TOKEN_ISSUER_KEY *key,uint8_t *out_nonce,uint8_t *out_private_metadata,
                      uint8_t *token,size_t token_len,int include_message,uint8_t *msg,
                      size_t msg_len)

{
  int iVar1;
  
  iVar1 = pmbtoken_exp2_init_method();
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    iVar1 = pmbtoken_read(&pmbtoken_exp2_method,key,out_nonce,out_private_metadata,token,token_len,
                          include_message,msg,msg_len);
  }
  return iVar1;
}

Assistant:

int pmbtoken_exp2_read(const TRUST_TOKEN_ISSUER_KEY *key,
                       uint8_t out_nonce[TRUST_TOKEN_NONCE_SIZE],
                       uint8_t *out_private_metadata, const uint8_t *token,
                       size_t token_len, int include_message,
                       const uint8_t *msg, size_t msg_len) {
  if (!pmbtoken_exp2_init_method()) {
    return 0;
  }
  return pmbtoken_read(&pmbtoken_exp2_method, key, out_nonce,
                       out_private_metadata, token, token_len, include_message,
                       msg, msg_len);
}